

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O3

CURLcode post_per_transfer(GlobalConfig *global,per_transfer *per,CURLcode result,_Bool *retryp,
                          long *delay)

{
  OutStruct *outs;
  OperationConfig *config;
  CURL *curl;
  FILE *pFVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  FILE *pFVar6;
  long *plVar7;
  byte bVar8;
  _Bool _Var9;
  int iVar10;
  int *piVar11;
  timediff_t tVar12;
  bool bVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  GlobalConfig *pGVar17;
  char *pcVar18;
  ulong uVar19;
  curltime cVar20;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  long oserrno;
  long code;
  char *local_e0;
  long local_d8;
  long *local_d0;
  long *local_c8;
  stat64 local_c0;
  
  config = per->config;
  curl = per->curl;
  *retryp = false;
  *delay = 0;
  if (config == (OperationConfig *)0x0 || curl == (CURL *)0x0) {
    return result;
  }
  bVar8 = per->field_0x1d8;
  local_c8 = delay;
  if ((bVar8 & 1) != 0) {
    close(per->infd);
    bVar8 = per->field_0x1d8;
  }
  pFVar6 = tool_stderr;
  outs = &per->outs;
  if ((bVar8 & 0x20) != 0) goto LAB_0011606a;
  if (((result == CURLE_OK) || ((*(uint *)&config->field_0x4ec & 0x10000) != 0)) ||
     ((*(ushort *)&global->field_0x63 & 0x180) == 0x100)) {
    if ((config->field_0x4e6 & 4) != 0) {
      local_c0.st_dev = 0;
      curl_easy_getinfo(curl,0x200002,&local_c0);
      if ((399 < (long)local_c0.st_dev) &&
         (result = CURLE_HTTP_RETURNED_ERROR, (*(ushort *)&global->field_0x63 & 0x180) != 0x100)) {
        curl_mfprintf(tool_stderr,"curl: (%d) The requested URL returned error: %ld\n",0x16);
      }
    }
    if (result == CURLE_OK) {
      if ((((config->field_0x4ec & 2) != 0) && (((per->outs).field_0x8 & 8) != 0)) &&
         (pFVar1 = (FILE *)(per->outs).stream, pFVar1 != (FILE *)0x0)) {
        pcVar18 = per->url;
        iVar10 = fileno(pFVar1);
        iVar10 = fwrite_xattr(curl,pcVar18,iVar10);
        if (iVar10 != 0) {
          pGVar17 = config->global;
          pcVar18 = outs->filename;
          piVar11 = __errno_location();
          strerror(*piVar11);
          warnf(pGVar17,"Error setting extended attributes on \'%s\': %s",pcVar18);
        }
      }
      result = CURLE_OK;
      if (((per->outs).stream == (FILE *)0x0) && (result = CURLE_OK, (per->outs).bytes == 0)) {
        local_c0.st_dev = 0;
        result = CURLE_OK;
        curl_easy_getinfo(curl,0x200023,&local_c0);
        if (local_c0.st_dev == 0) {
          _Var9 = tool_create_output_file(outs,config);
          result = CURLE_WRITE_ERROR;
          if (_Var9) {
            result = CURLE_OK;
          }
        }
      }
    }
  }
  else {
    pcVar18 = per->errorbuffer;
    if ((pcVar18 == (char *)0x0) || (*pcVar18 == '\0')) {
      pcVar18 = (char *)curl_easy_strerror(result);
    }
    curl_mfprintf(pFVar6,"curl: (%d) %s\n",result,pcVar18);
    if (result == CURLE_PEER_FAILED_VERIFICATION) {
      fputs("More details here: https://curl.se/docs/sslcerts.html\n\ncurl failed to verify the legitimacy of the server and therefore could not\nestablish a secure connection to it. To learn more about this situation and\nhow to fix it, please visit the webpage mentioned above.\n"
            ,(FILE *)tool_stderr);
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
  }
  if ((((((per->outs).field_0x8 & 4) == 0) &&
       (pFVar1 = (FILE *)(per->outs).stream, pFVar1 != (FILE *)0x0)) &&
      (iVar10 = fflush(pFVar1), result == CURLE_OK)) && (iVar10 != 0)) {
    errorf(global,"Failed writing body");
    result = CURLE_WRITE_ERROR;
  }
  if (per->retry_remaining == 0) goto LAB_00115f30;
  if (config->retry_maxtime != 0) {
    cVar20 = curlx_now();
    uVar2 = (per->retrystart).tv_sec;
    uVar3 = (per->retrystart).tv_usec;
    older.tv_usec = uVar3;
    older.tv_sec = uVar2;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar20._0_12_,0);
    newer.tv_usec = SUB124(cVar20._0_12_,8);
    older._12_4_ = 0;
    tVar12 = curlx_timediff(newer,older);
    if (SBORROW8(tVar12,config->retry_maxtime * 1000) == tVar12 + config->retry_maxtime * -1000 < 0)
    goto LAB_00115f30;
  }
  local_c0.st_dev = 0;
  if ((result < CURLE_OBSOLETE29) &&
     (uVar19 = 2, (0x10001060U >> (result & CURLE_FTP_COULDNT_USE_REST) & 1) != 0)) {
LAB_00115aff:
    local_e0 = (char *)0x0;
    local_d0 = &per->retry_sleep;
    lVar16 = per->retry_sleep;
LAB_00115b15:
    pcVar18 = "s";
    if (lVar16 - 1000U < 1000) {
      pcVar18 = "";
    }
    pcVar15 = "y";
    if (1 < per->retry_remaining) {
      pcVar15 = "ies";
    }
    warnf(config->global,"Problem %s. Will retry in %ld second%s. %ld retr%s left.",
          post_per_transfer::m[uVar19],lVar16 / 1000,pcVar18,per->retry_remaining,pcVar15);
    plVar7 = local_c8;
    per->retry_remaining = per->retry_remaining + -1;
    if (config->retry_delay == 0) {
      lVar14 = 600000;
      if (*local_d0 < 0x493e1) {
        lVar14 = *local_d0 * 2;
      }
      *local_d0 = lVar14;
    }
    if ((((per->outs).bytes != 0) && (outs->filename != (char *)0x0)) &&
       ((per->outs).stream != (FILE *)0x0)) {
      notef(config->global,"Throwing away %ld bytes");
      fflush((FILE *)(per->outs).stream);
      iVar10 = fileno((FILE *)(per->outs).stream);
      iVar10 = ftruncate64(iVar10,(per->outs).init);
      if (iVar10 == 0) {
        iVar10 = fseek((FILE *)(per->outs).stream,0,2);
        if (iVar10 == 0) {
          (per->outs).bytes = 0;
          goto LAB_0011617f;
        }
        pGVar17 = config->global;
        pcVar18 = "Failed seeking to end of file";
      }
      else {
        pGVar17 = config->global;
        pcVar18 = "Failed to truncate file";
      }
      errorf(pGVar17,pcVar18);
      return CURLE_WRITE_ERROR;
    }
LAB_0011617f:
    *retryp = true;
    per->num_retries = per->num_retries + 1;
    *plVar7 = lVar16;
    return CURLE_OK;
  }
  uVar19 = *(ulong *)&config->field_0x4e4;
  if ((result == CURLE_COULDNT_CONNECT) && ((uVar19 & 0x80000000000000) != 0)) {
    local_e0 = (char *)0x0;
    curl_easy_getinfo(curl,0x200019,&local_e0);
    uVar19 = (ulong)((uint)(local_e0 == (char *)0x6f) * 3);
  }
  else {
    if (result != CURLE_OK) {
      if (((uint)uVar19 >> 0x11 & 1) == 0) {
        if ((result != CURLE_HTTP_RETURNED_ERROR) || ((uVar19 & 0x40000) == 0)) {
LAB_00115d8c:
          curl_easy_getinfo(curl,0x200002,&local_c0);
          curl_easy_getinfo(curl,0x100031,&local_e0);
          pcVar18 = proto_token(local_e0);
          bVar13 = local_c0.st_dev - 400 < 100 && (pcVar18 == proto_ftps || pcVar18 == proto_ftp);
          uVar19 = (ulong)((uint)bVar13 + (uint)bVar13 * 4);
          goto LAB_00115dfb;
        }
      }
      else if (result != CURLE_HTTP_RETURNED_ERROR) goto LAB_00115d8c;
    }
    uVar19 = 0;
    curl_easy_getinfo(curl,0x100031,&local_e0);
    local_e0 = proto_token(local_e0);
    if ((local_e0 == proto_http) || (local_e0 == proto_https)) {
      uVar19 = 0;
      curl_easy_getinfo(curl,0x200002,&local_c0);
      if (((local_c0.st_dev - 500 < 5) && (local_c0.st_dev - 500 != 1)) ||
         ((local_c0.st_dev == 0x1ad || (local_c0.st_dev == 0x198)))) {
        uVar19 = 4;
      }
    }
  }
LAB_00115dfb:
  iVar10 = (int)uVar19;
  if ((result == CURLE_OK) || (iVar10 != 0)) {
    if (iVar10 != 0) {
      local_e0 = (char *)0x0;
      local_d0 = &per->retry_sleep;
      lVar16 = per->retry_sleep;
      if (iVar10 == 4) {
        local_d8 = per->retry_sleep;
        curl_easy_getinfo(curl,0x600039,&local_e0);
        uVar19 = 4;
        lVar16 = local_d8;
        if (local_e0 != (char *)0x0) {
          lVar14 = (long)local_e0 * 1000;
          if (lVar14 - local_d8 != 0 && local_d8 <= lVar14) {
            lVar16 = lVar14;
          }
          if (0x20c49ba5e353f7 < (long)local_e0) {
            lVar16 = 0x7fffffffffffffff;
          }
          if (config->retry_maxtime != 0) {
            local_d8 = lVar16;
            cVar20 = curlx_now();
            uVar4 = (per->retrystart).tv_sec;
            uVar5 = (per->retrystart).tv_usec;
            older_00.tv_usec = uVar5;
            older_00.tv_sec = uVar4;
            newer_00._12_4_ = 0;
            newer_00.tv_sec = SUB128(cVar20._0_12_,0);
            newer_00.tv_usec = SUB124(cVar20._0_12_,8);
            older_00._12_4_ = 0;
            tVar12 = curlx_timediff(newer_00,older_00);
            if ((0x7fffffffffffffff - (long)local_e0 < tVar12 / 1000) ||
               (lVar16 = local_d8, config->retry_maxtime < (long)(local_e0 + tVar12 / 1000))) {
              warnf(config->global,
                    "The Retry-After: time would make this command line exceed the maximum allowed time for retries."
                   );
              goto LAB_00115f30;
            }
          }
        }
      }
      goto LAB_00115b15;
    }
  }
  else {
    uVar19 = 1;
    if ((config->field_0x4ea & 0x40) != 0) goto LAB_00115aff;
  }
LAB_00115f30:
  if ((global->progressmode == 1) && ((per->progressbar).calls != 0)) {
    fputs("\n",(FILE *)(per->progressbar).out);
  }
  if ((((per->outs).field_0x8 & 8) == 0) ||
     (pFVar1 = (FILE *)(per->outs).stream, pFVar1 == (FILE *)0x0)) {
    if (result != CURLE_OK) goto LAB_0011606a;
LAB_00115faa:
    result = CURLE_OK;
    if ((((config->field_0x4e4 & 1) != 0) && (((per->outs).field_0x8 & 4) != 0)) &&
       (outs->filename != (char *)0x0)) {
      local_c0.st_dev = 0xffffffffffffffff;
      result = CURLE_OK;
      curl_easy_getinfo(curl,0x60000e,&local_c0);
      setfiletime(local_c0.st_dev,outs->filename,global);
    }
  }
  else {
    iVar10 = fclose(pFVar1);
    if ((result == CURLE_OK) && (iVar10 != 0)) {
      result = CURLE_WRITE_ERROR;
      errorf(config->global,"curl: (%d) Failed writing body",0x17);
    }
    else if (result == CURLE_OK) goto LAB_00115faa;
    if ((config->field_0x4ee & 0x20) != 0) {
      iVar10 = stat64(outs->filename,&local_c0);
      if ((iVar10 == 0) && ((local_c0.st_mode & 0xf000) == 0x8000)) {
        iVar10 = unlink(outs->filename);
        pcVar18 = outs->filename;
        if (iVar10 == 0) {
          notef(global,"Removed output file: %s",pcVar18);
          goto LAB_0011606a;
        }
        pcVar15 = "Failed removing: %s";
      }
      else {
        pcVar18 = outs->filename;
        pcVar15 = "Skipping removal; not a regular file: %s";
      }
      warnf(global,pcVar15,pcVar18);
    }
  }
LAB_0011606a:
  if (config->writeout != (char *)0x0) {
    ourWriteOut(config,per,result);
  }
  bVar8 = (per->heads).field_0x8;
  if (((bVar8 & 8) != 0) && (pFVar1 = (FILE *)(per->heads).stream, pFVar1 != (FILE *)0x0)) {
    fclose(pFVar1);
    bVar8 = (per->heads).field_0x8;
  }
  if ((bVar8 & 1) != 0) {
    free((per->heads).filename);
    (per->heads).filename = (char *)0x0;
  }
  bVar8 = (per->etag_save).field_0x8;
  if (((bVar8 & 8) != 0) && (pFVar1 = (FILE *)(per->etag_save).stream, pFVar1 != (FILE *)0x0)) {
    fclose(pFVar1);
    bVar8 = (per->etag_save).field_0x8;
  }
  if ((bVar8 & 1) != 0) {
    free((per->etag_save).filename);
    (per->etag_save).filename = (char *)0x0;
  }
  curl_easy_cleanup(per->curl);
  if (((per->outs).field_0x8 & 1) != 0) {
    free(outs->filename);
  }
  free(per->url);
  free(per->outfile);
  free(per->uploadfile);
  if ((global->field_0x63 & 1) != 0) {
    free(per->errorbuffer);
  }
  curl_slist_free_all((per->hdrcbdata).headlist);
  (per->hdrcbdata).headlist = (curl_slist *)0x0;
  return result;
}

Assistant:

static CURLcode post_per_transfer(struct GlobalConfig *global,
                                  struct per_transfer *per,
                                  CURLcode result,
                                  bool *retryp,
                                  long *delay) /* milliseconds! */
{
  struct OutStruct *outs = &per->outs;
  CURL *curl = per->curl;
  struct OperationConfig *config = per->config;
  int rc;

  *retryp = FALSE;
  *delay = 0; /* for no retry, keep it zero */

  if(!curl || !config)
    return result;

  if(per->infdopen)
    close(per->infd);

  if(per->skip)
    goto skip;

#ifdef __VMS
  if(is_vms_shell()) {
    /* VMS DCL shell behavior */
    if(global->silent && !global->showerror)
      vms_show = VMSSTS_HIDE;
  }
  else
#endif
    if(!config->synthetic_error && result &&
       (!global->silent || global->showerror)) {
      const char *msg = per->errorbuffer;
      fprintf(tool_stderr, "curl: (%d) %s\n", result,
              (msg && msg[0]) ? msg : curl_easy_strerror(result));
      if(result == CURLE_PEER_FAILED_VERIFICATION)
        fputs(CURL_CA_CERT_ERRORMSG, tool_stderr);
    }
    else if(config->failwithbody) {
      /* if HTTP response >= 400, return error */
      long code = 0;
      curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &code);
      if(code >= 400) {
        if(!global->silent || global->showerror)
          fprintf(tool_stderr,
                  "curl: (%d) The requested URL returned error: %ld\n",
                  CURLE_HTTP_RETURNED_ERROR, code);
        result = CURLE_HTTP_RETURNED_ERROR;
      }
    }
  /* Set file extended attributes */
  if(!result && config->xattr && outs->fopened && outs->stream) {
    rc = fwrite_xattr(curl, per->url, fileno(outs->stream));
    if(rc)
      warnf(config->global, "Error setting extended attributes on '%s': %s",
            outs->filename, strerror(errno));
  }

  if(!result && !outs->stream && !outs->bytes) {
    /* we have received no data despite the transfer was successful
       ==> force creation of an empty output file (if an output file
       was specified) */
    long cond_unmet = 0L;
    /* do not create (or even overwrite) the file in case we get no
       data because of unmet condition */
    curl_easy_getinfo(curl, CURLINFO_CONDITION_UNMET, &cond_unmet);
    if(!cond_unmet && !tool_create_output_file(outs, config))
      result = CURLE_WRITE_ERROR;
  }

  if(!outs->s_isreg && outs->stream) {
    /* Dump standard stream buffered data */
    rc = fflush(outs->stream);
    if(!result && rc) {
      /* something went wrong in the writing process */
      result = CURLE_WRITE_ERROR;
      errorf(global, "Failed writing body");
    }
  }

#ifdef _WIN32
  /* Discard incomplete UTF-8 sequence buffered from body */
  if(outs->utf8seq[0])
    memset(outs->utf8seq, 0, sizeof(outs->utf8seq));
#endif

  /* if retry-max-time is non-zero, make sure we have not exceeded the
     time */
  if(per->retry_remaining &&
     (!config->retry_maxtime ||
      (curlx_timediff(curlx_now(), per->retrystart) <
       config->retry_maxtime*1000L)) ) {
    enum {
      RETRY_NO,
      RETRY_ALL_ERRORS,
      RETRY_TIMEOUT,
      RETRY_CONNREFUSED,
      RETRY_HTTP,
      RETRY_FTP,
      RETRY_LAST /* not used */
    } retry = RETRY_NO;
    long response = 0;
    if((CURLE_OPERATION_TIMEDOUT == result) ||
       (CURLE_COULDNT_RESOLVE_HOST == result) ||
       (CURLE_COULDNT_RESOLVE_PROXY == result) ||
       (CURLE_FTP_ACCEPT_TIMEOUT == result))
      /* retry timeout always */
      retry = RETRY_TIMEOUT;
    else if(config->retry_connrefused &&
            (CURLE_COULDNT_CONNECT == result)) {
      long oserrno = 0;
      curl_easy_getinfo(curl, CURLINFO_OS_ERRNO, &oserrno);
      if(SOCKECONNREFUSED == oserrno)
        retry = RETRY_CONNREFUSED;
    }
    else if((CURLE_OK == result) ||
            ((config->failonerror || config->failwithbody) &&
             (CURLE_HTTP_RETURNED_ERROR == result))) {
      /* If it returned OK. _or_ failonerror was enabled and it
         returned due to such an error, check for HTTP transient
         errors to retry on. */
      const char *scheme;
      curl_easy_getinfo(curl, CURLINFO_SCHEME, &scheme);
      scheme = proto_token(scheme);
      if(scheme == proto_http || scheme == proto_https) {
        /* This was HTTP(S) */
        curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response);

        switch(response) {
        case 408: /* Request Timeout */
        case 429: /* Too Many Requests (RFC6585) */
        case 500: /* Internal Server Error */
        case 502: /* Bad Gateway */
        case 503: /* Service Unavailable */
        case 504: /* Gateway Timeout */
          retry = RETRY_HTTP;
          /*
           * At this point, we have already written data to the output
           * file (or terminal). If we write to a file, we must rewind
           * or close/re-open the file so that the next attempt starts
           * over from the beginning.
           *
           * For the upload case, we might need to start over reading from a
           * previous point if we have uploaded something when this was
           * returned.
           */
          break;
        }
      }
    } /* if CURLE_OK */
    else if(result) {
      const char *scheme;

      curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response);
      curl_easy_getinfo(curl, CURLINFO_SCHEME, &scheme);
      scheme = proto_token(scheme);

      if((scheme == proto_ftp || scheme == proto_ftps) && response / 100 == 4)
        /*
         * This is typically when the FTP server only allows a certain
         * amount of users and we are not one of them. All 4xx codes
         * are transient.
         */
        retry = RETRY_FTP;
    }

    if(result && !retry && config->retry_all_errors)
      retry = RETRY_ALL_ERRORS;

    if(retry) {
      long sleeptime = 0;
      curl_off_t retry_after = 0;
      static const char * const m[]={
        NULL,
        "(retrying all errors)",
        ": timeout",
        ": connection refused",
        ": HTTP error",
        ": FTP error"
      };

      sleeptime = per->retry_sleep;
      if(RETRY_HTTP == retry) {
        curl_easy_getinfo(curl, CURLINFO_RETRY_AFTER, &retry_after);
        if(retry_after) {
          /* store in a 'long', make sure it does not overflow */
          if(retry_after > LONG_MAX/1000)
            sleeptime = LONG_MAX;
          else if((retry_after * 1000) > sleeptime)
            sleeptime = (long)retry_after * 1000; /* milliseconds */

          /* if adding retry_after seconds to the process would exceed the
             maximum time allowed for retrying, then exit the retries right
             away */
          if(config->retry_maxtime) {
            curl_off_t seconds = curlx_timediff(curlx_now(),
                                                per->retrystart)/1000;

            if((CURL_OFF_T_MAX - retry_after < seconds) ||
               (seconds + retry_after > config->retry_maxtime)) {
              warnf(config->global, "The Retry-After: time would "
                    "make this command line exceed the maximum allowed time "
                    "for retries.");
              goto noretry;
            }
          }
        }
      }
      warnf(config->global, "Problem %s. "
            "Will retry in %ld second%s. "
            "%ld retr%s left.",
            m[retry], sleeptime/1000L,
            (sleeptime/1000L == 1 ? "" : "s"),
            per->retry_remaining,
            (per->retry_remaining > 1 ? "ies" : "y"));

      per->retry_remaining--;
      if(!config->retry_delay) {
        per->retry_sleep *= 2;
        if(per->retry_sleep > RETRY_SLEEP_MAX)
          per->retry_sleep = RETRY_SLEEP_MAX;
      }
      if(outs->bytes && outs->filename && outs->stream) {
        /* We have written data to an output file, we truncate file
         */
        notef(config->global,
              "Throwing away %"  CURL_FORMAT_CURL_OFF_T " bytes",
              outs->bytes);
        fflush(outs->stream);
        /* truncate file at the position where we started appending */
#if defined(HAVE_FTRUNCATE) && !defined(__DJGPP__) && !defined(__AMIGA__) && \
  !defined(__MINGW32CE__)
        if(ftruncate(fileno(outs->stream), outs->init)) {
          /* when truncate fails, we cannot just append as then we will
             create something strange, bail out */
          errorf(config->global, "Failed to truncate file");
          return CURLE_WRITE_ERROR;
        }
        /* now seek to the end of the file, the position where we
           just truncated the file in a large file-safe way */
        rc = fseek(outs->stream, 0, SEEK_END);
#else
        /* ftruncate is not available, so just reposition the file
           to the location we would have truncated it. This will not
           work properly with large files on 32-bit systems, but
           most of those will have ftruncate. */
        rc = fseek(outs->stream, (long)outs->init, SEEK_SET);
#endif
        if(rc) {
          errorf(config->global, "Failed seeking to end of file");
          return CURLE_WRITE_ERROR;
        }
        outs->bytes = 0; /* clear for next round */
      }
      *retryp = TRUE;
      per->num_retries++;
      *delay = sleeptime;
      return CURLE_OK;
    }
  } /* if retry_remaining */
noretry:

  if((global->progressmode == CURL_PROGRESS_BAR) &&
     per->progressbar.calls)
    /* if the custom progress bar has been displayed, we output a
       newline here */
    fputs("\n", per->progressbar.out);

  /* Close the outs file */
  if(outs->fopened && outs->stream) {
    rc = fclose(outs->stream);
    if(!result && rc) {
      /* something went wrong in the writing process */
      result = CURLE_WRITE_ERROR;
      errorf(config->global, "curl: (%d) Failed writing body", result);
    }
    if(result && config->rm_partial) {
      struct_stat st;
      if(!stat(outs->filename, &st) &&
         S_ISREG(st.st_mode)) {
        if(!unlink(outs->filename))
          notef(global, "Removed output file: %s", outs->filename);
        else
          warnf(global, "Failed removing: %s", outs->filename);
      }
      else
        warnf(global, "Skipping removal; not a regular file: %s",
              outs->filename);
    }
  }

  /* File time can only be set _after_ the file has been closed */
  if(!result && config->remote_time && outs->s_isreg && outs->filename) {
    /* Ask libcurl if we got a remote file time */
    curl_off_t filetime = -1;
    curl_easy_getinfo(curl, CURLINFO_FILETIME_T, &filetime);
    setfiletime(filetime, outs->filename, global);
  }
skip:
  /* Write the --write-out data before cleanup but after result is final */
  if(config->writeout)
    ourWriteOut(config, per, result);

  /* Close function-local opened file descriptors */
  if(per->heads.fopened && per->heads.stream)
    fclose(per->heads.stream);

  if(per->heads.alloc_filename)
    curlx_safefree(per->heads.filename);

  if(per->etag_save.fopened && per->etag_save.stream)
    fclose(per->etag_save.stream);

  if(per->etag_save.alloc_filename)
    curlx_safefree(per->etag_save.filename);

  curl_easy_cleanup(per->curl);
  if(outs->alloc_filename)
    free(outs->filename);
  free(per->url);
  free(per->outfile);
  free(per->uploadfile);
  if(global->parallel)
    free(per->errorbuffer);
  curl_slist_free_all(per->hdrcbdata.headlist);
  per->hdrcbdata.headlist = NULL;
  return result;
}